

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uint uVar1;
  u8 *puVar2;
  int iVar3;
  i64 iVar4;
  sqlite3_str *p;
  char *z;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  RtreeCell cell;
  Rtree tree;
  undefined1 local_458 [16];
  undefined1 *local_448;
  u8 *puStack_440;
  RtreeNode *local_438;
  RtreeCell local_430;
  Rtree local_400;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_458._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_458._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_440 = &DAT_aaaaaaaaaaaaaaaa;
  local_448 = &DAT_aaaaaaaaaaaaaaaa;
  local_438 = (RtreeNode *)&DAT_aaaaaaaaaaaaaaaa;
  memset(&local_400,0xaa,0x3c8);
  local_458 = (undefined1  [16])0x0;
  local_448 = (undefined1 *)0x0;
  puStack_440 = (u8 *)0x0;
  local_438 = (RtreeNode *)0x0;
  memset(&local_400,0,0x3c8);
  iVar4 = sqlite3VdbeIntValue(*apArg);
  local_400.nDim = (u8)iVar4;
  if (0xfffffffa < ((uint)iVar4 & 0xff) - 6) {
    local_400.nDim2 = local_400.nDim * '\x02';
    local_400.nBytesPerCell = local_400.nDim * '\b' + 8;
    puStack_440 = (u8 *)sqlite3_value_blob(apArg[1]);
    if (puStack_440 != (u8 *)0x0) {
      iVar3 = sqlite3ValueBytes(apArg[1],'\x01');
      if ((3 < iVar3) &&
         ((int)((uint)local_400.nBytesPerCell *
               (uint)(ushort)(*(ushort *)(puStack_440 + 2) << 8 | *(ushort *)(puStack_440 + 2) >> 8)
               ) <= iVar3)) {
        p = sqlite3_str_new((sqlite3 *)0x0);
        puVar2 = puStack_440;
        if ((*(ushort *)(puStack_440 + 2) & 0xff) != 0 || *(ushort *)(puStack_440 + 2) >> 8 != 0) {
          uVar8 = (ulong)local_400.nDim2;
          uVar6 = 0;
          do {
            local_430.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
            local_430.aCoord[4].i = -1;
            local_430.aCoord[5].i = -1;
            local_430.aCoord[6].i = -1;
            local_430.aCoord[7].i = -1;
            local_430.aCoord[0].i = -1;
            local_430.aCoord[1].i = -1;
            local_430.aCoord[2].i = -1;
            local_430.aCoord[3].i = -1;
            local_430.aCoord[8] = (RtreeCoord)0xffffffff;
            local_430.aCoord[9] = (RtreeCoord)0xffffffff;
            nodeGetCell(&local_400,(RtreeNode *)local_458,uVar6,&local_430);
            if (uVar6 != 0) {
              uVar1 = p->nChar;
              uVar5 = uVar1 + 1;
              if (uVar5 < p->nAlloc) {
                p->nChar = uVar5;
                p->zText[uVar1] = ' ';
              }
              else {
                enlargeAndAppend(p," ",1);
              }
            }
            sqlite3_str_appendf(p,"{%lld",local_430.iRowid);
            if (uVar8 != 0) {
              uVar7 = 0;
              do {
                sqlite3_str_appendf(p," %g",(double)local_430.aCoord[uVar7].f);
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
            uVar1 = p->nChar;
            uVar5 = uVar1 + 1;
            if (uVar5 < p->nAlloc) {
              p->nChar = uVar5;
              p->zText[uVar1] = '}';
            }
            else {
              enlargeAndAppend(p,"}",1);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ushort)(*(ushort *)(puVar2 + 2) << 8 | *(ushort *)(puVar2 + 2) >> 8));
        }
        if (p == (sqlite3_str *)0x0) {
          uVar6 = 7;
        }
        else {
          uVar6 = (uint)p->accError;
        }
        sqlite3_result_error_code(ctx,uVar6);
        z = sqlite3_str_finish(p);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          setResultStrOrError(ctx,z,-1,'\x01',sqlite3_free);
          return;
        }
        goto LAB_001f798a;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001f798a:
  __stack_chk_fail();
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  if( node.zData==0 ) return;
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_error_code(ctx, errCode);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
}